

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

bool __thiscall
FxStructMember::RequestAddress(FxStructMember *this,FCompileContext *ctx,bool *writable)

{
  uint flags;
  bool bVar1;
  byte bVar2;
  
  flags = this->membervar->Flags;
  if (((flags >> 0xd & 1) != 0) || (this->AddressRequested = true, writable == (bool *)0x0))
  goto LAB_00513b8b;
  if (this->AddressWritable == true) {
    bVar1 = FCompileContext::CheckReadOnly(ctx,flags);
    if (bVar1) goto LAB_00513b87;
    bVar1 = DObject::IsKindOf((DObject *)this->classx->ValueType,PPointer::RegistrationInfo.MyClass)
    ;
    bVar2 = true;
    if (bVar1) {
      bVar2 = *(byte *)&this->classx->ValueType[1].super_PTypeBase.super_DObject.Class ^ 1;
    }
  }
  else {
LAB_00513b87:
    bVar2 = false;
  }
  *writable = (bool)bVar2;
LAB_00513b8b:
  return (flags >> 0xd & 1) == 0;
}

Assistant:

bool FxStructMember::RequestAddress(FCompileContext &ctx, bool *writable)
{
	// Cannot take the address of metadata variables.
	if (membervar->Flags & VARF_Static)
	{
		return false;
	}
	AddressRequested = true;
	if (writable != nullptr) *writable = (AddressWritable && !ctx.CheckReadOnly(membervar->Flags) &&
											(!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) || !static_cast<PPointer*>(classx->ValueType)->IsConst));
	return true;
}